

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::net::Socket_testFailConnectURI_Test::TestBody(Socket_testFailConnectURI_Test *this)

{
  char cVar1;
  socklen_t in_ECX;
  allocator local_130 [8];
  Socket socket;
  Socket local_118 [8];
  URI uri;
  
  Socket::Socket(&socket);
  Socket::open(&socket,(char *)0x2,1);
  std::__cxx11::string::string((string *)local_118,"http://127.0.0.1:12345",local_130);
  jaegertracing::net::URI::parse((string *)&uri);
  std::__cxx11::string::~string((string *)local_118);
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    Socket::connect(local_118,(int)&socket,(sockaddr *)&uri,in_ECX);
  }
  testing::Message::Message((Message *)local_118);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_130,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x38,
             "Expected: socket.connect(uri) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_130,(Message *)local_118);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_130);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_118);
  URI::~URI(&uri);
  Socket::~Socket(&socket);
  return;
}

Assistant:

TEST(Socket, testFailConnectURI)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    const auto uri = URI::parse("http://127.0.0.1:12345");
    ASSERT_THROW(socket.connect(uri), std::runtime_error);
}